

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

bb_insn_t_conflict add_new_bb_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,bb_t_conflict bb,int append_p)

{
  bb_insn_t_conflict elem;
  bb_insn_t_conflict bb_insn;
  int append_p_local;
  bb_t_conflict bb_local;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  elem = create_bb_insn(gen_ctx,insn,bb);
  if (append_p == 0) {
    DLIST_bb_insn_t_prepend(&bb->bb_insns,elem);
  }
  else {
    DLIST_bb_insn_t_append(&bb->bb_insns,elem);
  }
  return elem;
}

Assistant:

static bb_insn_t add_new_bb_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, bb_t bb, int append_p) {
  bb_insn_t bb_insn = create_bb_insn (gen_ctx, insn, bb);

  if (append_p)
    DLIST_APPEND (bb_insn_t, bb->bb_insns, bb_insn);
  else
    DLIST_PREPEND (bb_insn_t, bb->bb_insns, bb_insn);
  return bb_insn;
}